

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLMatcherSD.cpp
# Opt level: O0

void anon_unknown.dwarf_106b47c::createLiteralBindings
               (Literal *baseLit,LiteralList *alts,Clause *instCl,uint **boundVarData,
               TermList ***altBindingPtrs,TermList **altBindingData)

{
  uint *puVar1;
  TermList *this;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  uint uVar7;
  Term *instance;
  long *in_RCX;
  List<Kernel::Literal_*> *in_RSI;
  long *in_R8;
  long *in_R9;
  ArrayStoringBinder binder_2;
  ArrayStoringBinder binder_1;
  ArrayStoringBinder binder;
  Literal *alit;
  Iterator ait;
  uint numVars;
  uint var_1;
  uint nextPos;
  uint var;
  VariableIterator bvit;
  undefined4 in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  VariableIterator *in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  Term *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  uint in_stack_fffffffffffffed8;
  undefined2 in_stack_fffffffffffffedc;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  Literal *in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefa;
  undefined1 in_stack_fffffffffffffefb;
  uint in_stack_fffffffffffffefc;
  Term *in_stack_ffffffffffffff18;
  VariableIterator *in_stack_ffffffffffffff20;
  ArrayStoringBinder local_d8;
  ArrayStoringBinder *in_stack_ffffffffffffff38;
  Term *in_stack_ffffffffffffff40;
  Term *base;
  Iterator local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  TermList local_98;
  uint local_8c;
  long *local_30;
  long *local_28;
  long *local_20;
  List<Kernel::Literal_*> *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  if (((anonymous_namespace)::
       createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
       ::variablePositions == '\0') &&
     (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
                                   ::variablePositions), iVar6 != 0)) {
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::DHMap
              (&createLiteralBindings::variablePositions);
    __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                 ,&createLiteralBindings::variablePositions,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
                         ::variablePositions);
  }
  if (((anonymous_namespace)::
       createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
       ::varNums == '\0') &&
     (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
                                   ::varNums), iVar6 != 0)) {
    Lib::BinaryHeap<unsigned_int,_Lib::Int>::BinaryHeap(&createLiteralBindings::varNums);
    __cxa_atexit(Lib::BinaryHeap<unsigned_int,_Lib::Int>::~BinaryHeap,
                 &createLiteralBindings::varNums,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
                         ::varNums);
  }
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&createLiteralBindings::variablePositions);
  Lib::BinaryHeap<unsigned_int,_Lib::Int>::reset(&createLiteralBindings::varNums);
  Kernel::VariableIterator::VariableIterator(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  while (bVar2 = Kernel::VariableIterator::hasNext
                           ((VariableIterator *)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)), bVar2) {
    local_98 = Kernel::VariableIterator::next
                         ((VariableIterator *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    local_8c = Kernel::TermList::var(&local_98);
    Lib::BinaryHeap<unsigned_int,_Lib::Int>::insert
              ((BinaryHeap<unsigned_int,_Lib::Int> *)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac);
  }
  local_9c = 0;
  while (bVar2 = Lib::BinaryHeap<unsigned_int,_Lib::Int>::isEmpty(&createLiteralBindings::varNums),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_fffffffffffffefc =
         Lib::BinaryHeap<unsigned_int,_Lib::Int>::pop
                   ((BinaryHeap<unsigned_int,_Lib::Int> *)in_stack_fffffffffffffeb0);
    local_a0 = in_stack_fffffffffffffefc;
    while( true ) {
      in_stack_fffffffffffffefb =
           Lib::BinaryHeap<unsigned_int,_Lib::Int>::isEmpty(&createLiteralBindings::varNums);
      in_stack_fffffffffffffefa = false;
      if (!(bool)in_stack_fffffffffffffefb) {
        in_stack_fffffffffffffef0 =
             (Literal *)
             Lib::BinaryHeap<unsigned_int,_Lib::Int>::top(&createLiteralBindings::varNums);
        in_stack_fffffffffffffefa =
             *(uint *)&(in_stack_fffffffffffffef0->super_Term)._vptr_Term == local_a0;
      }
      if ((bool)in_stack_fffffffffffffefa == false) break;
      Lib::BinaryHeap<unsigned_int,_Lib::Int>::pop
                ((BinaryHeap<unsigned_int,_Lib::Int> *)in_stack_fffffffffffffeb0);
    }
    in_stack_fffffffffffffeef =
         Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::insert
                   ((DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash> *)
                    in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    if ((bool)in_stack_fffffffffffffeef) {
      puVar1 = (uint *)*local_20;
      *local_20 = (long)(puVar1 + 1);
      *puVar1 = local_a0;
      local_9c = local_9c + 1;
    }
  }
  local_a4 = local_9c;
  Lib::List<Kernel::Literal_*>::Iterator::Iterator(&local_b0,local_10);
  while (uVar3 = Lib::List<Kernel::Literal_*>::Iterator::hasNext((Iterator *)0x8a93a6), (bool)uVar3)
  {
    instance = &Lib::List<Kernel::Literal_*>::Iterator::next((Iterator *)in_stack_fffffffffffffeb0)
                ->super_Term;
    base = instance;
    uVar4 = Kernel::Literal::isEquality((Literal *)0x8a93e7);
    if ((bool)uVar4) {
      uVar5 = Kernel::MatchingUtils::matchArgs
                        (in_stack_fffffffffffffec0,
                         (Term *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if ((bool)uVar5) {
        ArrayStoringBinder::ArrayStoringBinder
                  ((ArrayStoringBinder *)&stack0xffffffffffffff38,(TermList *)*local_30,
                   &createLiteralBindings::variablePositions);
        Kernel::MatchingUtils::matchArgs<(anonymous_namespace)::ArrayStoringBinder>
                  (base,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        *(long *)*local_28 = *local_30;
        *local_28 = *local_28 + 8;
        *local_30 = *local_30 + (ulong)local_a4 * 8;
        this = (TermList *)*local_30;
        *local_30 = (long)(this + 1);
        in_stack_fffffffffffffed8 =
             Kernel::Clause::getLiteralPosition
                       ((Clause *)
                        CONCAT44(in_stack_fffffffffffffefc,
                                 CONCAT13(in_stack_fffffffffffffefb,
                                          CONCAT12(in_stack_fffffffffffffefa,
                                                   in_stack_fffffffffffffef8))),
                        in_stack_fffffffffffffef0);
        Kernel::TermList::setContent(this,(ulong)in_stack_fffffffffffffed8);
      }
      bVar2 = Kernel::MatchingUtils::matchReversedArgs
                        ((Literal *)in_stack_fffffffffffffec0,
                         (Literal *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (bVar2) {
        ArrayStoringBinder::ArrayStoringBinder
                  (&local_d8,(TermList *)*local_30,&createLiteralBindings::variablePositions);
        Kernel::MatchingUtils::matchReversedArgs<(anonymous_namespace)::ArrayStoringBinder>
                  ((Literal *)
                   CONCAT17(in_stack_fffffffffffffeef,CONCAT16(uVar3,in_stack_fffffffffffffee8)),
                   (Literal *)instance,
                   (ArrayStoringBinder *)
                   CONCAT17(uVar4,CONCAT16(uVar5,CONCAT24(in_stack_fffffffffffffedc,
                                                          in_stack_fffffffffffffed8))));
        *(long *)*local_28 = *local_30;
        *local_28 = *local_28 + 8;
        *local_30 = *local_30 + (ulong)local_a4 * 8;
        in_stack_fffffffffffffec0 = (Term *)*local_30;
        *local_30 = (long)&in_stack_fffffffffffffec0->_functor;
        uVar7 = Kernel::Clause::getLiteralPosition
                          ((Clause *)
                           CONCAT44(in_stack_fffffffffffffefc,
                                    CONCAT13(in_stack_fffffffffffffefb,
                                             CONCAT12(in_stack_fffffffffffffefa,
                                                      in_stack_fffffffffffffef8))),
                           in_stack_fffffffffffffef0);
        Kernel::TermList::setContent((TermList *)in_stack_fffffffffffffec0,(ulong)uVar7);
      }
    }
    else {
      if (local_a4 != 0) {
        ArrayStoringBinder::ArrayStoringBinder
                  ((ArrayStoringBinder *)&stack0xffffffffffffff18,(TermList *)*local_30,
                   &createLiteralBindings::variablePositions);
        bVar2 = Kernel::MatchingUtils::matchArgs<(anonymous_namespace)::ArrayStoringBinder>
                          (base,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        in_stack_fffffffffffffebc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffebc);
      }
      *(long *)*local_28 = *local_30;
      *local_28 = *local_28 + 8;
      *local_30 = *local_30 + (ulong)local_a4 * 8;
      in_stack_fffffffffffffeb0 = (VariableIterator *)*local_30;
      *local_30 = (long)&(in_stack_fffffffffffffeb0->super_IteratorCore<Kernel::TermList>)._refCnt;
      in_stack_fffffffffffffeb8 =
           Kernel::Clause::getLiteralPosition
                     ((Clause *)
                      CONCAT44(in_stack_fffffffffffffefc,
                               CONCAT13(in_stack_fffffffffffffefb,
                                        CONCAT12(in_stack_fffffffffffffefa,in_stack_fffffffffffffef8
                                                ))),in_stack_fffffffffffffef0);
      Kernel::TermList::setContent
                ((TermList *)in_stack_fffffffffffffeb0,(ulong)in_stack_fffffffffffffeb8);
    }
  }
  Kernel::VariableIterator::~VariableIterator(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void createLiteralBindings(Literal* baseLit, LiteralList const* const alts, Clause* instCl, unsigned*& boundVarData, TermList**& altBindingPtrs, TermList*& altBindingData)
{
  static UUMap variablePositions;
  static BinaryHeap<unsigned,Int> varNums;
  variablePositions.reset();
  varNums.reset();

  VariableIterator bvit(baseLit);
  while(bvit.hasNext()) {
    unsigned var=bvit.next().var();
    varNums.insert(var);
  }

  // Add (unique) variables in baseLit to boundVarData in ascending order.
  // At the same time, fill the map variablePositions which maps each variable to its position in this sorted sequence.
  unsigned nextPos=0;
  while(!varNums.isEmpty()) {
    unsigned var=varNums.pop();
    while(!varNums.isEmpty() && varNums.top()==var) {
      varNums.pop();
    }
    if(variablePositions.insert(var,nextPos)) {
      *(boundVarData++)=var;
      nextPos++;
    }
  }
  unsigned numVars=nextPos;

  LiteralList::Iterator ait(alts);
  while(ait.hasNext()) {
    Literal* alit=ait.next();
    if(alit->isEquality()) {
      //we must try both possibilities
      if(MatchingUtils::matchArgs(baseLit,alit)) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        MatchingUtils::matchArgs(baseLit,alit,binder);
        *altBindingPtrs=altBindingData;
        altBindingPtrs++;
        altBindingData+=numVars;
        // add index of the literal in instance clause at the end of the binding sequence
        (altBindingData++)->setContent(instCl->getLiteralPosition(alit));
      }
      if(MatchingUtils::matchReversedArgs(baseLit, alit)) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        MatchingUtils::matchReversedArgs(baseLit, alit, binder);
        *altBindingPtrs=altBindingData;
        altBindingPtrs++;
        altBindingData+=numVars;
        // add index of the literal in instance clause at the end of the binding sequence
        (altBindingData++)->setContent(instCl->getLiteralPosition(alit));
      }
    } else {
      if(numVars) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        ALWAYS(MatchingUtils::matchArgs(baseLit,alit,binder));
      }

      *altBindingPtrs=altBindingData;
      altBindingPtrs++;
      altBindingData+=numVars;
      // add index of the literal in instance clause at the end of the binding sequence
      (altBindingData++)->setContent(instCl->getLiteralPosition(alit));
    }
  }
}